

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O3

int __thiscall
boost::xpressive::detail::
dynamic_xpression<boost::xpressive::detail::repeat_end_matcher<mpl_::bool_<false>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::link(dynamic_xpression<boost::xpressive::detail::repeat_end_matcher<mpl_::bool_<false>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *this,char *__from,char *__to)

{
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = *(long *)(__from + 0x30);
  if (lVar3 == *(long *)(__from + 0x38)) {
    lVar3 = *(long *)(*(long *)(__from + 0x48) + -8) + 0x200;
  }
  (this->super_repeat_end_matcher<mpl_::bool_<false>_>).back_ = *(void **)(lVar3 + -8);
  std::deque<const_void_*,_std::allocator<const_void_*>_>::pop_back
            ((deque<const_void_*,_std::allocator<const_void_*>_> *)__from);
  pmVar1 = (this->next_).xpr_.px;
  iVar2 = (*(pmVar1->
            super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._vptr_matchable[3])(pmVar1,__from);
  return iVar2;
}

Assistant:

virtual void link(xpression_linker<char_type> &linker) const
    {
        linker.accept(*static_cast<Matcher const *>(this), this->next_.matchable().get());
        this->next_.link(linker);
    }